

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataViewDefault.cpp
# Opt level: O3

bool __thiscall Rml::DataViewRml::Update(DataViewRml *this,DataModel *model)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  code *pcVar2;
  size_type __n;
  bool bVar3;
  int iVar4;
  Element *element;
  DataExpression *this_00;
  _Alloc_hider __s1;
  String new_rml;
  Variant variant;
  DataExpressionInterface expr_interface;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  String local_88;
  Variant local_68;
  DataExpressionInterface local_40;
  
  Variant::Variant(&local_68);
  element = DataView::GetElement((DataView *)this);
  DataExpressionInterface::DataExpressionInterface(&local_40,model,element,(Event *)0x0);
  if (element != (Element *)0x0) {
    this_00 = (this->super_DataViewCommon).expression._M_t.
              super___uniq_ptr_impl<Rml::DataExpression,_std::default_delete<Rml::DataExpression>_>.
              _M_t.
              super__Tuple_impl<0UL,_Rml::DataExpression_*,_std::default_delete<Rml::DataExpression>_>
              .super__Head_base<0UL,_Rml::DataExpression_*,_false>._M_head_impl;
    if (this_00 == (DataExpression *)0x0) {
      bVar3 = Assert("RMLUI_ASSERT(expression)",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/DataViewDefault.cpp"
                     ,0x4f);
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      this_00 = (this->super_DataViewCommon).expression._M_t.
                super___uniq_ptr_impl<Rml::DataExpression,_std::default_delete<Rml::DataExpression>_>
                ._M_t.
                super__Tuple_impl<0UL,_Rml::DataExpression_*,_std::default_delete<Rml::DataExpression>_>
                .super__Head_base<0UL,_Rml::DataExpression_*,_false>._M_head_impl;
    }
    bVar3 = DataExpression::Run(this_00,&local_40,&local_68);
    if (bVar3) {
      paVar1 = &local_a8.field_2;
      local_a8._M_string_length = 0;
      local_a8.field_2._M_local_buf[0] = '\0';
      local_a8._M_dataplus._M_p = (pointer)paVar1;
      Variant::
      GetInto<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_68,&local_a8);
      __n = local_a8._M_string_length;
      __s1._M_p = local_a8._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p == paVar1) {
        local_88.field_2._8_8_ = local_a8.field_2._8_8_;
        __s1._M_p = (pointer)&local_88.field_2;
      }
      local_88.field_2._M_allocated_capacity._1_7_ = local_a8.field_2._M_allocated_capacity._1_7_;
      local_88.field_2._M_local_buf[0] = local_a8.field_2._M_local_buf[0];
      local_88._M_string_length = local_a8._M_string_length;
      local_a8._M_string_length = 0;
      local_a8.field_2._M_local_buf[0] = '\0';
      local_a8._M_dataplus._M_p = (pointer)paVar1;
      local_88._M_dataplus._M_p = __s1._M_p;
      if ((__n == (this->previous_rml)._M_string_length) &&
         ((__n == 0 ||
          (iVar4 = bcmp(__s1._M_p,(this->previous_rml)._M_dataplus._M_p,__n), iVar4 == 0)))) {
        bVar3 = false;
      }
      else {
        Element::SetInnerRML(element,&local_88);
        ::std::__cxx11::string::operator=((string *)&this->previous_rml,(string *)&local_88);
        bVar3 = true;
        __s1._M_p = local_88._M_dataplus._M_p;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__s1._M_p != &local_88.field_2) {
        operator_delete(__s1._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      goto LAB_00203580;
    }
  }
  bVar3 = false;
LAB_00203580:
  Variant::~Variant(&local_68);
  return bVar3;
}

Assistant:

bool DataViewRml::Update(DataModel& model)
{
	bool result = false;
	Variant variant;
	Element* element = GetElement();
	DataExpressionInterface expr_interface(&model, element);

	if (element && GetExpression().Run(expr_interface, variant))
	{
		String new_rml = variant.Get<String>();
		if (new_rml != previous_rml)
		{
			element->SetInnerRML(new_rml);
			previous_rml = std::move(new_rml);
			result = true;
		}
	}
	return result;
}